

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

piece_index_t __thiscall
libtorrent::aux::torrent::get_piece_to_super_seed
          (torrent *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bits)

{
  pointer pppVar1;
  peer_connection *this_00;
  bool bVar2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar3;
  ulong uVar4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar9;
  pointer pppVar10;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar11;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar12;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  torrent *__range3;
  piece_index_t local_60;
  int local_5c;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_58;
  iterator iStack_50;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_48;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_40;
  torrent *local_38;
  
  local_58 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  iStack_50._M_current = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  local_48 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0;
  local_40 = bits;
  local_38 = this;
  iVar3 = file_storage::piece_range
                    (&((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files);
  iVar6 = -1;
  sVar9 = iVar3._end.m_val;
  if (iVar3._begin.m_val.m_val != sVar9.m_val) {
    local_5c = 9999;
    ptVar11 = local_40;
    do {
      sVar12 = iVar3._begin.m_val;
      sVar5.m_val = sVar12.m_val + 0x1f;
      if (-1 < sVar12.m_val) {
        sVar5.m_val = sVar12.m_val;
      }
      uVar8 = 0x80000000 >> ((byte)iVar3._begin.m_val & 0x1f);
      local_60.m_val = sVar12.m_val;
      if ((*(uint *)((long)(ptVar11->super_bitfield).m_buf.
                           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                     + 4 + (long)(sVar5.m_val >> 5) * 4) &
          (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)) == 0) {
        pppVar10 = (local_38->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pppVar1 = (local_38->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pppVar10 == pppVar1) {
          iVar6 = 0;
        }
        else {
          iVar7 = 0;
          do {
            this_00 = *pppVar10;
            iVar6 = 999;
            if (((this_00->m_superseed_piece)._M_elems[0].m_val == local_60.m_val) ||
               ((this_00->m_superseed_piece)._M_elems[1].m_val == local_60.m_val)) break;
            bVar2 = peer_connection::has_piece(this_00,local_60);
            iVar7 = iVar7 + (uint)bVar2;
            pppVar10 = pppVar10 + 1;
            iVar6 = iVar7;
          } while (pppVar10 != pppVar1);
        }
        ptVar11 = local_40;
        if (iVar6 <= local_5c) {
          if (iVar6 == local_5c) {
            if (iStack_50._M_current == local_48) {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
              ::
              _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                        ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                          *)&local_58,iStack_50,&local_60);
            }
            else {
              (iStack_50._M_current)->m_val = local_60.m_val;
LAB_0031cea6:
              iStack_50._M_current = iStack_50._M_current + 1;
            }
          }
          else {
            if (iStack_50._M_current != local_58) {
              iStack_50._M_current = local_58;
            }
            if (iStack_50._M_current != local_48) {
              (iStack_50._M_current)->m_val = local_60.m_val;
              local_5c = iVar6;
              goto LAB_0031cea6;
            }
            ::std::
            vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
            ::
            _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                      ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                        *)&local_58,iStack_50,&local_60);
            local_5c = iVar6;
          }
        }
      }
      iVar3._begin.m_val = sVar12.m_val + 1;
      iVar3._end.m_val = 0;
    } while (iVar3._begin.m_val != sVar9.m_val);
    if (local_58 == iStack_50._M_current) {
      iVar6 = -1;
      if (iStack_50._M_current == (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)0x0
         ) {
        return (piece_index_t)-1;
      }
    }
    else {
      uVar4 = random((aux *)(ulong)((int)((ulong)((long)iStack_50._M_current - (long)local_58) >> 2)
                                   - 1));
      iVar6 = local_58[uVar4 & 0xffffffff].m_val;
    }
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return (piece_index_t)iVar6;
}

Assistant:

piece_index_t torrent::get_piece_to_super_seed(typed_bitfield<piece_index_t> const& bits)
	{
		// return a piece with low availability that is not in
		// the bitfield and that is not currently being super
		// seeded by any peer
		TORRENT_ASSERT(m_super_seeding);

		// do a linear search from the first piece
		int min_availability = 9999;
		std::vector<piece_index_t> avail_vec;
		for (auto const i : m_torrent_file->piece_range())
		{
			if (bits[i]) continue;

			int availability = 0;
			for (auto* pc : *this)
			{
				if (pc->super_seeded_piece(i))
				{
					// avoid super-seeding the same piece to more than one
					// peer if we can avoid it. Do this by artificially
					// increase the availability
					availability = 999;
					break;
				}
				if (pc->has_piece(i)) ++availability;
			}
			if (availability > min_availability) continue;
			if (availability == min_availability)
			{
				avail_vec.push_back(i);
				continue;
			}
			TORRENT_ASSERT(availability < min_availability);
			min_availability = availability;
			avail_vec.clear();
			avail_vec.push_back(i);
		}

		if (avail_vec.empty()) return piece_index_t{-1};
		return avail_vec[random(std::uint32_t(avail_vec.size() - 1))];
	}